

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_geom_edge(REF_GRID ref_grid,REF_INT node)

{
  REF_DBL *pRVar1;
  REF_INTERP pRVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double local_358;
  double local_348;
  double local_338;
  double local_328;
  bool local_31a;
  double local_318;
  double local_310;
  double local_300;
  double local_2f0;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rsb_2;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL accept;
  REF_INTERP ref_interp;
  REF_INT interp_guess;
  REF_STATUS interp_status;
  REF_INT sense;
  REF_INT edge_nodes [27];
  int local_1ac;
  REF_BOOL verbose;
  REF_INT tries;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL t_target;
  REF_DBL backoff;
  REF_DBL q;
  REF_DBL t;
  REF_DBL tangent [3];
  REF_DBL dt_ds;
  REF_DBL dt;
  REF_DBL xyz_orig [3];
  double local_128;
  REF_DBL dxyz_dt [6];
  REF_DBL dxyz [3];
  REF_DBL local_d8;
  REF_DBL total_force [3];
  int local_b4;
  double dStack_b0;
  REF_INT ixyz;
  REF_DBL min_uv_area;
  REF_DBL normdev;
  REF_DBL normdev_orig;
  REF_DBL q_orig;
  REF_DBL r1orig;
  REF_DBL r0orig;
  REF_DBL r1;
  REF_DBL r0;
  REF_DBL t1;
  REF_DBL t0;
  REF_DBL t_orig;
  REF_INT nnode;
  REF_INT nodes [2];
  REF_INT id;
  REF_BOOL geom_edge;
  REF_BOOL geom_node1;
  REF_BOOL geom_node0;
  REF_BOOL geom_node;
  REF_CELL edg;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->node;
  edg = (REF_CELL)ref_grid->geom;
  _geom_node0 = ref_grid->cell[0];
  pRVar2 = ref_grid->interp;
  if ((node < 0) || (ref_grid->cell[6]->ref_adj->nnode <= node)) {
    local_2dc = -1;
  }
  else {
    local_2dc = ref_grid->cell[6]->ref_adj->first[node];
  }
  if (local_2dc == -1) {
    if ((node < 0) || (ref_grid->cell[9]->ref_adj->nnode <= node)) {
      local_2e0 = -1;
    }
    else {
      local_2e0 = ref_grid->cell[9]->ref_adj->first[node];
    }
    if (local_2e0 == -1) {
      if ((node < 0) || (ref_grid->cell[10]->ref_adj->nnode <= node)) {
        local_2e4 = -1;
      }
      else {
        local_2e4 = ref_grid->cell[10]->ref_adj->first[node];
      }
      if (local_2e4 == -1) {
        if ((node < 0) || (ref_grid->cell[0xb]->ref_adj->nnode <= node)) {
          local_2e8 = -1;
        }
        else {
          local_2e8 = ref_grid->cell[0xb]->ref_adj->first[node];
        }
        if (local_2e8 == -1) {
          ref_node._4_4_ = node;
          pRStack_18 = ref_grid;
          uVar5 = ref_geom_is_a((REF_GEOM)edg,node,0,&geom_node1);
          if (uVar5 == 0) {
            uVar5 = ref_geom_is_a((REF_GEOM)edg,ref_node._4_4_,1,nodes + 1);
            if (uVar5 == 0) {
              if (geom_node1 == 0) {
                if (nodes[1] == 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x609,"ref_smooth_geom_edge","geom edge required");
                  ref_grid_local._4_4_ = 1;
                }
                else {
                  uVar5 = ref_geom_unique_id((REF_GEOM)edg,ref_node._4_4_,1,nodes);
                  if (uVar5 == 0) {
                    uVar5 = ref_cell_node_list_around
                                      (_geom_node0,ref_node._4_4_,2,(REF_INT *)&t_orig,
                                       (REF_INT *)((long)&t_orig + 4));
                    if (uVar5 == 0) {
                      if ((long)t_orig._0_4_ == 2) {
                        uVar5 = ref_geom_is_a((REF_GEOM)edg,t_orig._4_4_,0,&geom_edge);
                        if (uVar5 == 0) {
                          uVar5 = ref_geom_is_a((REF_GEOM)edg,nnode,0,&id);
                          if (uVar5 == 0) {
                            for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
                              total_force[(long)local_b4 + -1] = 0.0;
                            }
                            if (((id == 0) || ((geom_edge != 0 && (id != 0)))) &&
                               (uVar5 = ref_smooth_add_pliant_force
                                                  ((REF_NODE)ref_geom,ref_node._4_4_,t_orig._4_4_,
                                                   &local_d8), uVar5 != 0)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x616,"ref_smooth_geom_edge",(ulong)uVar5,"n0");
                              ref_grid_local._4_4_ = uVar5;
                            }
                            else if (((geom_edge == 0) || ((geom_edge != 0 && (id != 0)))) &&
                                    (uVar5 = ref_smooth_add_pliant_force
                                                       ((REF_NODE)ref_geom,ref_node._4_4_,nnode,
                                                        &local_d8), uVar5 != 0)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x619,"ref_smooth_geom_edge",(ulong)uVar5,"n1");
                              ref_grid_local._4_4_ = uVar5;
                            }
                            else {
                              for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
                                dxyz_dt[(long)local_b4 + 5] =
                                     pRStack_18->adapt->smooth_pliant_alpha *
                                     total_force[(long)local_b4 + -1];
                              }
                              interp_status = t_orig._4_4_;
                              sense = ref_node._4_4_;
                              edge_nodes[0] = nodes[0];
                              uVar5 = ref_geom_cell_tuv((REF_GEOM)edg,t_orig._4_4_,&interp_status,1,
                                                        &t1,&interp_guess);
                              if (uVar5 == 0) {
                                uVar5 = ref_geom_cell_tuv((REF_GEOM)edg,ref_node._4_4_,
                                                          &interp_status,1,&t0,&interp_guess);
                                if (uVar5 == 0) {
                                  interp_status = nnode;
                                  sense = ref_node._4_4_;
                                  edge_nodes[0] = nodes[0];
                                  uVar5 = ref_geom_cell_tuv((REF_GEOM)edg,nnode,&interp_status,1,&r0
                                                            ,&interp_guess);
                                  if (uVar5 == 0) {
                                    uVar5 = ref_egads_eval_at((REF_GEOM)edg,1,nodes[0],&t0,&dt,
                                                              &local_128);
                                    if (uVar5 == 0) {
                                      for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
                                        tangent[(long)local_b4 + -1] = dxyz_dt[(long)local_b4 + -1];
                                      }
                                      dVar7 = sqrt(dxyz_dt[1] * dxyz_dt[1] +
                                                   local_128 * local_128 + dxyz_dt[0] * dxyz_dt[0]);
                                      uVar5 = ref_math_normalize(&t);
                                      if (uVar5 == 0) {
                                        dVar8 = dxyz[1] * tangent[1] +
                                                dxyz_dt[5] * t + dxyz[0] * tangent[0];
                                        if (dVar7 * 1e+20 <= 0.0) {
                                          local_2f0 = -(dVar7 * 1e+20);
                                        }
                                        else {
                                          local_2f0 = dVar7 * 1e+20;
                                        }
                                        local_300 = dVar8;
                                        if (dVar8 <= 0.0) {
                                          local_300 = -dVar8;
                                        }
                                        if (local_2f0 <= local_300) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                 ,0x642,"ref_smooth_geom_edge",4,
                                                 "unable to invert dt/dxyz");
                                          ref_grid_local._4_4_ = 4;
                                        }
                                        else {
                                          min_ratio = t0 + dVar8 / dVar7;
                                          if (r0 <= t1) {
                                            local_310 = r0;
                                          }
                                          else {
                                            local_310 = t1;
                                          }
                                          if (local_310 <= min_ratio) {
                                            if (t1 <= r0) {
                                              local_318 = r0;
                                            }
                                            else {
                                              local_318 = t1;
                                            }
                                            if (min_ratio <= local_318) {
                                              uVar5 = ref_node_ratio((REF_NODE)ref_geom,t_orig._4_4_
                                                                     ,ref_node._4_4_,&r1orig);
                                              if (uVar5 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x650,"ref_smooth_geom_edge",(ulong)uVar5,
                                                  "get r0");
                                                return uVar5;
                                              }
                                              uVar5 = ref_node_ratio((REF_NODE)ref_geom,nnode,
                                                                     ref_node._4_4_,&q_orig);
                                              if (uVar5 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x651,"ref_smooth_geom_edge",(ulong)uVar5,
                                                  "get r1");
                                                return uVar5;
                                              }
                                              if (pRStack_18->surf == 0) {
                                                uVar5 = ref_smooth_tet_quality_around
                                                                  (pRStack_18,ref_node._4_4_,
                                                                   &normdev_orig);
                                                if (uVar5 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x655,"ref_smooth_geom_edge",(ulong)uVar5,
                                                  "q_orig");
                                                  return uVar5;
                                                }
                                              }
                                              else {
                                                normdev_orig = 1.0;
                                              }
                                              uVar5 = ref_smooth_tri_normdev_around
                                                                (pRStack_18,ref_node._4_4_,&normdev)
                                              ;
                                              if (uVar5 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x657,"ref_smooth_geom_edge",(ulong)uVar5,
                                                  "nd_orig");
                                                return uVar5;
                                              }
                                              ref_interp._4_4_ = -1;
                                              if ((pRVar2 != (REF_INTERP)0x0) &&
                                                 (pRVar2->continuously != 0)) {
                                                ref_interp._4_4_ = pRVar2->cell[ref_node._4_4_];
                                              }
                                              t_target = 1.0;
                                              local_1ac = 0;
                                              while( true ) {
                                                if (7 < local_1ac) {
                                                  uVar5 = ref_geom_add((REF_GEOM)edg,ref_node._4_4_,
                                                                       1,nodes[0],&t0);
                                                  if (uVar5 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x68c,"ref_smooth_geom_edge",(ulong)uVar5,"set t"
                                                  );
                                                  return uVar5;
                                                  }
                                                  uVar5 = ref_geom_constrain(pRStack_18,
                                                                             ref_node._4_4_);
                                                  if (uVar5 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x68d,"ref_smooth_geom_edge",(ulong)uVar5,
                                                  "constrain");
                                                  return uVar5;
                                                  }
                                                  uVar5 = ref_metric_interpolate_node
                                                                    (pRStack_18,ref_node._4_4_);
                                                  if ((uVar5 != 0) && (uVar5 != 5)) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x68e,"ref_smooth_geom_edge",(ulong)uVar5,
                                                  "interp");
                                                  return uVar5;
                                                  }
                                                  if ((pRStack_18->surf == 0) &&
                                                     (uVar5 = ref_smooth_tet_quality_around
                                                                        (pRStack_18,ref_node._4_4_,
                                                                         &backoff), uVar5 != 0)) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x693,"ref_smooth_geom_edge",(ulong)uVar5,"q");
                                                  return uVar5;
                                                  }
                                                  return 0;
                                                }
                                                q = t_target * min_ratio + (1.0 - t_target) * t0;
                                                uVar5 = ref_geom_add((REF_GEOM)edg,ref_node._4_4_,1,
                                                                     nodes[0],&q);
                                                if (uVar5 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x66a,"ref_smooth_geom_edge",(ulong)uVar5,"set t"
                                                  );
                                                  return uVar5;
                                                }
                                                uVar5 = ref_geom_constrain(pRStack_18,ref_node._4_4_
                                                                          );
                                                if (uVar5 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x66b,"ref_smooth_geom_edge",(ulong)uVar5,
                                                  "constrain");
                                                  return uVar5;
                                                }
                                                uVar5 = ref_metric_interpolate_node
                                                                  (pRStack_18,ref_node._4_4_);
                                                if ((uVar5 != 0) && (uVar5 != 5)) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x66d,"ref_smooth_geom_edge",(ulong)uVar5,
                                                  "ref_metric_interpolate_node failed");
                                                  return uVar5;
                                                }
                                                uVar6 = ref_node_ratio((REF_NODE)ref_geom,
                                                                       t_orig._4_4_,ref_node._4_4_,
                                                                       &r1);
                                                if (uVar6 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x66e,"ref_smooth_geom_edge",(ulong)uVar6,
                                                  "get r0");
                                                  return uVar6;
                                                }
                                                uVar6 = ref_node_ratio((REF_NODE)ref_geom,nnode,
                                                                       ref_node._4_4_,&r0orig);
                                                if (uVar6 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x66f,"ref_smooth_geom_edge",(ulong)uVar6,
                                                  "get r1");
                                                  return uVar6;
                                                }
                                                if (pRStack_18->surf == 0) {
                                                  uVar6 = ref_smooth_tet_quality_around
                                                                    (pRStack_18,ref_node._4_4_,
                                                                     &backoff);
                                                  if (uVar6 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x675,"ref_smooth_geom_edge",(ulong)uVar6,"q");
                                                  return uVar6;
                                                  }
                                                  uVar6 = ref_smooth_tet_ratio_around
                                                                    (pRStack_18,ref_node._4_4_,
                                                                     &max_ratio,(REF_DBL *)&verbose)
                                                  ;
                                                  if (uVar6 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x677,"ref_smooth_geom_edge",(ulong)uVar6,"ratio"
                                                  );
                                                  return uVar6;
                                                  }
                                                }
                                                else {
                                                  backoff = 1.0;
                                                  uVar6 = ref_smooth_tri_ratio_around
                                                                    (pRStack_18,ref_node._4_4_,
                                                                     &max_ratio,(REF_DBL *)&verbose)
                                                  ;
                                                  if (uVar6 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x673,"ref_smooth_geom_edge",(ulong)uVar6,"ratio"
                                                  );
                                                  return uVar6;
                                                  }
                                                }
                                                uVar6 = ref_smooth_tri_normdev_around
                                                                  (pRStack_18,ref_node._4_4_,
                                                                   &min_uv_area);
                                                if (uVar6 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x679,"ref_smooth_geom_edge",(ulong)uVar6,"nd");
                                                  return uVar6;
                                                }
                                                uVar6 = ref_smooth_tri_uv_area_around
                                                                  (pRStack_18,ref_node._4_4_,
                                                                   &stack0xffffffffffffff50);
                                                if (uVar6 != 0) break;
                                                pRVar1 = &pRStack_18->adapt->smooth_min_quality;
                                                local_31a = false;
                                                if (*pRVar1 <= backoff && backoff != *pRVar1) {
                                                  pRVar1 = &pRStack_18->adapt->post_min_normdev;
                                                  local_31a = *pRVar1 <= min_uv_area &&
                                                              min_uv_area != *pRVar1 ||
                                                              normdev < min_uv_area;
                                                }
                                                bVar3 = false;
                                                if (local_31a) {
                                                  bVar3 = *(double *)&ref_geom->manifold <=
                                                          dStack_b0 &&
                                                          dStack_b0 !=
                                                          *(double *)&ref_geom->manifold;
                                                }
                                                bVar4 = false;
                                                if (bVar3) {
                                                  if (r0orig <= r1) {
                                                    local_328 = r0orig;
                                                  }
                                                  else {
                                                    local_328 = r1;
                                                  }
                                                  if (q_orig <= r1orig) {
                                                    local_338 = q_orig;
                                                  }
                                                  else {
                                                    local_338 = r1orig;
                                                  }
                                                  bVar4 = local_338 * 0.9 < local_328;
                                                }
                                                bVar3 = false;
                                                if (bVar4) {
                                                  if (r1 <= r0orig) {
                                                    local_348 = r0orig;
                                                  }
                                                  else {
                                                    local_348 = r1;
                                                  }
                                                  if (r1orig <= q_orig) {
                                                    local_358 = q_orig;
                                                  }
                                                  else {
                                                    local_358 = r1orig;
                                                  }
                                                  bVar3 = local_348 < local_358 * 1.1;
                                                }
                                                if (bVar3) {
                                                  return 0;
                                                }
                                                t_target = t_target * 0.5;
                                                if ((ref_interp._4_4_ != -1) && (uVar5 != 0)) {
                                                  pRVar2->cell[ref_node._4_4_] = ref_interp._4_4_;
                                                }
                                                local_1ac = local_1ac + 1;
                                              }
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                                  ,0x67a,"ref_smooth_geom_edge",(ulong)uVar6,"a");
                                              return uVar6;
                                            }
                                          }
                                          ref_grid_local._4_4_ = 0;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                               ,0x63d,"ref_smooth_geom_edge",(ulong)uVar5,
                                               "form tangent");
                                        ref_grid_local._4_4_ = uVar5;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x63a,"ref_smooth_geom_edge",(ulong)uVar5,
                                             "eval edge derivatives");
                                      ref_grid_local._4_4_ = uVar5;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                           ,0x636,"ref_smooth_geom_edge",(ulong)uVar5,"get t1");
                                    ref_node_location((REF_NODE)ref_geom,nnode);
                                    ref_geom_tattle((REF_GEOM)edg,nnode);
                                    ref_grid_local._4_4_ = uVar5;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,0x62d,"ref_smooth_geom_edge",(ulong)uVar5,"get t_orig");
                                  ref_node_location((REF_NODE)ref_geom,ref_node._4_4_);
                                  ref_geom_tattle((REF_GEOM)edg,ref_node._4_4_);
                                  ref_grid_local._4_4_ = uVar5;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x627,"ref_smooth_geom_edge",(ulong)uVar5,"get t0");
                                ref_node_location((REF_NODE)ref_geom,t_orig._4_4_);
                                ref_geom_tattle((REF_GEOM)edg,t_orig._4_4_);
                                ref_grid_local._4_4_ = uVar5;
                              }
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x611,"ref_smooth_geom_edge",(ulong)uVar5,"node1");
                            ref_grid_local._4_4_ = uVar5;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x610,"ref_smooth_geom_edge",(ulong)uVar5,"node0");
                          ref_grid_local._4_4_ = uVar5;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x60d,"ref_smooth_geom_edge","expected two nodes",2,
                               (long)t_orig._0_4_);
                        ref_grid_local._4_4_ = 1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x60c,"ref_smooth_geom_edge",(ulong)uVar5,"edge neighbors");
                      ref_grid_local._4_4_ = uVar5;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x60b,"ref_smooth_geom_edge",(ulong)uVar5,"get id");
                    ref_grid_local._4_4_ = uVar5;
                  }
                }
              }
              else {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x608,"ref_smooth_geom_edge","geom node not allowed");
                ref_grid_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x607,"ref_smooth_geom_edge",(ulong)uVar5,"edge check");
              ref_grid_local._4_4_ = uVar5;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x606,"ref_smooth_geom_edge",(ulong)uVar5,"node check");
            ref_grid_local._4_4_ = uVar5;
          }
        }
        else {
          ref_grid_local._4_4_ = 0;
        }
      }
      else {
        ref_grid_local._4_4_ = 0;
      }
    }
    else {
      ref_grid_local._4_4_ = 0;
    }
  }
  else {
    ref_grid_local._4_4_ = 0;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_geom_edge(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL edg = ref_grid_edg(ref_grid);
  REF_BOOL geom_node, geom_node0, geom_node1, geom_edge;
  REF_INT id;
  REF_INT nodes[2], nnode;
  REF_DBL t_orig, t0, t1;
  REF_DBL r0, r1, r0orig, r1orig;
  REF_DBL q_orig;
  REF_DBL normdev_orig, normdev;
  REF_DBL min_uv_area;

  REF_INT ixyz;
  REF_DBL total_force[3];
  REF_DBL dxyz[3], dxyz_dt[6], xyz_orig[3], dt, dt_ds, tangent[3];

  REF_DBL t, q, backoff, t_target, min_ratio, max_ratio;
  REF_INT tries;
  REF_BOOL verbose = REF_FALSE;
  REF_INT edge_nodes[REF_CELL_MAX_SIZE_PER], sense;

  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL accept;

  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pri(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_hex(ref_grid), node)) return REF_SUCCESS;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
  RAS(!geom_node, "geom node not allowed");
  RAS(geom_edge, "geom edge required");

  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_EDGE, &id), "get id");
  RSS(ref_cell_node_list_around(edg, node, 2, &nnode, nodes), "edge neighbors");
  REIS(2, nnode, "expected two nodes");

  /* if node0 or node1 constrained by geometry, give precedence */
  RSS(ref_geom_is_a(ref_geom, nodes[0], REF_GEOM_NODE, &geom_node0), "node0");
  RSS(ref_geom_is_a(ref_geom, nodes[1], REF_GEOM_NODE, &geom_node1), "node1");

  for (ixyz = 0; ixyz < 3; ixyz++) total_force[ixyz] = 0.0;
  if (!geom_node1 || (geom_node0 && geom_node1))
    RSS(ref_smooth_add_pliant_force(ref_node, node, nodes[0], total_force),
        "n0");
  if (!geom_node0 || (geom_node0 && geom_node1))
    RSS(ref_smooth_add_pliant_force(ref_node, node, nodes[1], total_force),
        "n1");

  for (ixyz = 0; ixyz < 3; ixyz++)
    dxyz[ixyz] =
        ref_grid_adapt(ref_grid, smooth_pliant_alpha) * total_force[ixyz];

  edge_nodes[0] = nodes[0];
  edge_nodes[1] = node;
  edge_nodes[2] = id;
  RSB(ref_geom_cell_tuv(ref_geom, nodes[0], edge_nodes, REF_GEOM_EDGE, &t0,
                        &sense),
      "get t0", {
        ref_node_location(ref_node, nodes[0]);
        ref_geom_tattle(ref_geom, nodes[0]);
      });
  RSB(ref_geom_cell_tuv(ref_geom, node, edge_nodes, REF_GEOM_EDGE, &t_orig,
                        &sense),
      "get t_orig", {
        ref_node_location(ref_node, node);
        ref_geom_tattle(ref_geom, node);
      });
  edge_nodes[0] = nodes[1];
  edge_nodes[1] = node;
  edge_nodes[2] = id;
  RSB(ref_geom_cell_tuv(ref_geom, nodes[1], edge_nodes, REF_GEOM_EDGE, &t1,
                        &sense),
      "get t1", {
        ref_node_location(ref_node, nodes[1]);
        ref_geom_tattle(ref_geom, nodes[1]);
      });

  RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &t_orig, xyz_orig,
                        dxyz_dt),
      "eval edge derivatives");
  for (ixyz = 0; ixyz < 3; ixyz++) tangent[ixyz] = dxyz_dt[ixyz];
  dt_ds = sqrt(ref_math_dot(dxyz_dt, dxyz_dt));
  RSS(ref_math_normalize(tangent), "form tangent");
  dt = ref_math_dot(dxyz, tangent);
  if (ref_math_divisible(dt, dt_ds)) {
    dt /= dt_ds;
  } else {
    RSS(REF_DIV_ZERO, "unable to invert dt/dxyz");
  }
  t_target = t_orig + dt;

  /* reject a smooth point candidate outside of trange */
  if (t_target < MIN(t0, t1) || MAX(t0, t1) < t_target) {
    return REF_SUCCESS;
  }

  if (verbose) {
    printf("dxyz %f %f %f\n", dxyz[0], dxyz[1], dxyz[2]);
    printf("dxyz_dt %f %f %f\n", dxyz_dt[0], dxyz_dt[1], dxyz_dt[2]);
  }

  RSS(ref_node_ratio(ref_node, nodes[0], node, &r0orig), "get r0");
  RSS(ref_node_ratio(ref_node, nodes[1], node, &r1orig), "get r1");
  if (ref_grid_surf(ref_grid)) {
    q_orig = 1.0;
  } else {
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &q_orig), "q_orig");
  }
  RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev_orig), "nd_orig");
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  if (verbose) printf("edge %d t %f %f %f q %f\n", id, t0, t_orig, t1, q_orig);

  if (verbose)
    printf("t_target %f at %f %f %f\n", t_target,
           ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
           ref_node_xyz(ref_node, 2, node));

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    t = backoff * t_target + (1.0 - backoff) * t_orig;

    RSS(ref_geom_add(ref_geom, node, REF_GEOM_EDGE, id, &t), "set t");
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    RSS(ref_node_ratio(ref_node, nodes[0], node, &r0), "get r0");
    RSS(ref_node_ratio(ref_node, nodes[1], node, &r1), "get r1");
    if (ref_grid_surf(ref_grid)) {
      q = 1.0;
      RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    } else {
      RSS(ref_smooth_tet_quality_around(ref_grid, node, &q), "q");
      RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    }
    RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev), "nd");
    RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area), "a");

    accept = (q > ref_grid_adapt(ref_grid, smooth_min_quality));
    accept = accept && (normdev > ref_grid_adapt(ref_grid, post_min_normdev) ||
                        normdev > normdev_orig);
    accept = accept && (min_uv_area > ref_node_min_uv_area(ref_node));
    accept = accept && (MIN(r0, r1) > 0.9 * MIN(r0orig, r1orig));
    accept = accept && (MAX(r0, r1) < 1.1 * MAX(r0orig, r1orig));

    if (verbose) printf("t %f r %f %f q %f \n", t, r0, r1, q);
    if (accept) {
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_EDGE, id, &t_orig), "set t");
  RSS(ref_geom_constrain(ref_grid, node), "constrain");
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  if (ref_grid_surf(ref_grid)) {
    q = 1.0;
  } else {
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &q), "q");
  }
  if (verbose) printf("undo q %f\n", q);

  return REF_SUCCESS;
}